

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

ByteString * __thiscall ByteString::operator+=(ByteString *this,uchar byte)

{
  ByteString *in_RDI;
  vector<unsigned_char,_SecureAllocator<unsigned_char>_> *unaff_retaddr;
  
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::push_back
            (unaff_retaddr,(value_type_conflict1 *)in_RDI);
  return in_RDI;
}

Assistant:

ByteString& ByteString::operator+=(const unsigned char byte)
{
	byteString.push_back(byte);

	return *this;
}